

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_file.c
# Opt level: O0

FFSRecordType FFSnext_record_type(FFSFile ffsfile)

{
  long in_RDI;
  FFSRecordType next;
  FFSFile in_stack_000000a8;
  FFSFile in_stack_ffffffffffffffe8;
  undefined4 local_c;
  
  local_c = next_record_type(in_stack_000000a8);
  while ((local_c & *(FFSRecordType *)(in_RDI + 0x98)) != local_c) {
    FFSconsume_next_item(in_stack_ffffffffffffffe8);
    local_c = next_record_type(in_stack_000000a8);
  }
  return local_c;
}

Assistant:

FFSRecordType
FFSnext_record_type(FFSFile ffsfile)
{
    FFSRecordType next = next_record_type(ffsfile);
    while ((next & ffsfile->visible_items_bitmap) != next) {
	FFSconsume_next_item(ffsfile);
	next = next_record_type(ffsfile);
    }
    return next;
}